

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O3

SColor __thiscall irr::gui::CGUIButton::getActiveColor(CGUIButton *this)

{
  byte bVar1;
  u32 uVar2;
  undefined8 *puVar3;
  
  if (this->OverrideColorEnabled != true) {
    puVar3 = (undefined8 *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if ((puVar3 != (undefined8 *)0x0) && (this->OverrideColorEnabled != true)) {
      bVar1 = (**(code **)(*(long *)this + 0x90))(this);
      uVar2 = (**(code **)*puVar3)(puVar3,bVar1 ^ 9);
      return (SColor)uVar2;
    }
  }
  return (SColor)(this->OverrideColor).color;
}

Assistant:

irr::video::SColor CGUIButton::getActiveColor() const
{
	if (OverrideColorEnabled)
		return OverrideColor;
	IGUISkin *skin = Environment->getSkin();
	if (skin)
		return OverrideColorEnabled ? OverrideColor : skin->getColor(isEnabled() ? EGDC_BUTTON_TEXT : EGDC_GRAY_TEXT);
	return OverrideColor;
}